

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O1

void __thiscall
QWidgetTextControlPrivate::extendWordwiseSelection
          (QWidgetTextControlPrivate *this,int suggestedNewPosition,qreal mouseXPosition)

{
  QWidgetTextControl *this_00;
  undefined1 *puVar1;
  char cVar2;
  int iVar3;
  MoveMode MVar4;
  int iVar5;
  MoveMode MVar6;
  int iVar7;
  MoveMode MVar8;
  MoveOperation MVar9;
  long in_FS_OFFSET;
  double dVar10;
  double dVar11;
  QTextLine QVar12;
  QTextCursor curs;
  undefined1 *local_78;
  int local_6c;
  undefined1 *local_68;
  QTextEngine *pQStack_60;
  undefined1 *local_58;
  QTextEngine *pQStack_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetTextControl **)&this->field_0x8;
  iVar3 = QTextCursor::selectionStart();
  if ((iVar3 <= suggestedNewPosition) &&
     (iVar3 = QTextCursor::selectionEnd(), suggestedNewPosition <= iVar3)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QWidgetTextControl::setTextCursor(this_00,&this->selectedWordOnDoubleClick,false);
      return;
    }
    goto LAB_004c7fbb;
  }
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  QTextCursor::QTextCursor((QTextCursor *)&local_78,&this->selectedWordOnDoubleClick);
  MVar9 = (MoveOperation)(QTextCursor *)&local_78;
  QTextCursor::setPosition(MVar9,suggestedNewPosition);
  cVar2 = QTextCursor::movePosition(MVar9,5,0);
  if (cVar2 != '\0') {
    MVar4 = QTextCursor::position();
    QTextCursor::block();
    iVar3 = QTextBlock::position();
    QTextCursor::block();
    (**(code **)(*(long *)this_00 + 0x80))(&local_58,this_00,&local_68);
    puVar1 = local_58;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_50 = (QTextEngine *)&DAT_aaaaaaaaaaaaaaaa;
    QVar12 = currentTextLine((QTextCursor *)&local_78);
    pQStack_50 = QVar12.eng;
    local_58 = (undefined1 *)CONCAT44(local_58._4_4_,QVar12.index);
    if (pQStack_50 != (QTextEngine *)0x0) {
      iVar5 = QTextCursor::position();
      local_68 = (undefined1 *)CONCAT44(local_68._4_4_,iVar5 - iVar3);
      dVar10 = (double)QTextLine::cursorToX((int *)&local_58,(Edge)&local_68);
      cVar2 = QTextCursor::movePosition((MoveOperation)&local_78,0xe,0);
      if (cVar2 != '\0') {
        MVar6 = QTextCursor::position();
        local_68 = &DAT_aaaaaaaaaaaaaaaa;
        pQStack_60 = (QTextEngine *)&DAT_aaaaaaaaaaaaaaaa;
        QVar12 = currentTextLine((QTextCursor *)&local_78);
        pQStack_60 = QVar12.eng;
        local_68 = (undefined1 *)CONCAT44(local_68._4_4_,QVar12.index);
        iVar5 = QTextLine::textStart();
        iVar7 = QTextLine::textStart();
        if ((MVar6 != MVar4) && (iVar5 == iVar7)) {
          local_6c = QTextCursor::position();
          local_6c = local_6c - iVar3;
          dVar11 = (double)QTextLine::cursorToX((int *)&local_58,(Edge)&local_6c);
          iVar3 = (int)this;
          if (this->wordSelectionEnabled == false) {
            dVar10 = dVar10 + (double)puVar1;
            if ((mouseXPosition < dVar10) ||
               (dVar11 = (double)puVar1 + dVar11, dVar11 < mouseXPosition)) goto LAB_004c7f55;
            iVar5 = QTextCursor::position();
            if (suggestedNewPosition < iVar5) {
              MVar8 = QTextCursor::selectionEnd();
            }
            else {
              MVar8 = QTextCursor::selectionStart();
            }
            QTextCursor::setPosition(iVar3 + 0x88,MVar8);
            if (dVar11 - mouseXPosition <= mouseXPosition - dVar10) goto LAB_004c7f29;
          }
          else {
            iVar5 = QTextCursor::position();
            if (suggestedNewPosition < iVar5) {
              MVar6 = QTextCursor::selectionEnd();
              QTextCursor::setPosition(iVar3 + 0x88,MVar6);
            }
            else {
              MVar4 = QTextCursor::selectionStart();
              QTextCursor::setPosition(iVar3 + 0x88,MVar4);
LAB_004c7f29:
              MVar4 = MVar6;
            }
          }
          QTextCursor::setPosition(iVar3 + 0x88,MVar4);
          if (((this->interactionFlags).super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
               super_QFlagsStorage<Qt::TextInteractionFlag>.i & 1) != 0) {
            setClipboardSelection(this);
            selectionChanged(this,true);
          }
        }
      }
    }
  }
LAB_004c7f55:
  QTextCursor::~QTextCursor((QTextCursor *)&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_004c7fbb:
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControlPrivate::extendWordwiseSelection(int suggestedNewPosition, qreal mouseXPosition)
{
    Q_Q(QWidgetTextControl);

    // if inside the initial selected word keep that
    if (suggestedNewPosition >= selectedWordOnDoubleClick.selectionStart()
        && suggestedNewPosition <= selectedWordOnDoubleClick.selectionEnd()) {
        q->setTextCursor(selectedWordOnDoubleClick);
        return;
    }

    QTextCursor curs = selectedWordOnDoubleClick;
    curs.setPosition(suggestedNewPosition, QTextCursor::KeepAnchor);

    if (!curs.movePosition(QTextCursor::StartOfWord))
        return;
    const int wordStartPos = curs.position();

    const int blockPos = curs.block().position();
    const QPointF blockCoordinates = q->blockBoundingRect(curs.block()).topLeft();

    QTextLine line = currentTextLine(curs);
    if (!line.isValid())
        return;

    const qreal wordStartX = line.cursorToX(curs.position() - blockPos) + blockCoordinates.x();

    if (!curs.movePosition(QTextCursor::EndOfWord))
        return;
    const int wordEndPos = curs.position();

    const QTextLine otherLine = currentTextLine(curs);
    if (otherLine.textStart() != line.textStart()
        || wordEndPos == wordStartPos)
        return;

    const qreal wordEndX = line.cursorToX(curs.position() - blockPos) + blockCoordinates.x();

    if (!wordSelectionEnabled && (mouseXPosition < wordStartX || mouseXPosition > wordEndX))
        return;

    if (wordSelectionEnabled) {
        if (suggestedNewPosition < selectedWordOnDoubleClick.position()) {
            cursor.setPosition(selectedWordOnDoubleClick.selectionEnd());
            setCursorPosition(wordStartPos, QTextCursor::KeepAnchor);
        } else {
            cursor.setPosition(selectedWordOnDoubleClick.selectionStart());
            setCursorPosition(wordEndPos, QTextCursor::KeepAnchor);
        }
    } else {
        // keep the already selected word even when moving to the left
        // (#39164)
        if (suggestedNewPosition < selectedWordOnDoubleClick.position())
            cursor.setPosition(selectedWordOnDoubleClick.selectionEnd());
        else
            cursor.setPosition(selectedWordOnDoubleClick.selectionStart());

        const qreal differenceToStart = mouseXPosition - wordStartX;
        const qreal differenceToEnd = wordEndX - mouseXPosition;

        if (differenceToStart < differenceToEnd)
            setCursorPosition(wordStartPos, QTextCursor::KeepAnchor);
        else
            setCursorPosition(wordEndPos, QTextCursor::KeepAnchor);
    }

    if (interactionFlags & Qt::TextSelectableByMouse) {
#ifndef QT_NO_CLIPBOARD
        setClipboardSelection();
#endif
        selectionChanged(true);
    }
}